

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void freevalue(MOJOSHADER_effectValue *value,MOJOSHADER_free f,void *d)

{
  uint local_24;
  int i;
  void *d_local;
  MOJOSHADER_free f_local;
  MOJOSHADER_effectValue *value_local;
  
  (*f)(value->name,d);
  (*f)(value->semantic,d);
  freetypeinfo(&value->type,f,d);
  if (((((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER) ||
       ((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D)) ||
      ((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D)) ||
     (((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D ||
      ((value->type).parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)))) {
    for (local_24 = 0; local_24 < value->value_count; local_24 = local_24 + 1) {
      freevalue((MOJOSHADER_effectValue *)
                ((long)(value->field_4).values + (long)(int)local_24 * 0x48 + 8),f,d);
    }
  }
  (*f)((value->field_4).values,d);
  return;
}

Assistant:

void freevalue(MOJOSHADER_effectValue *value, MOJOSHADER_free f, void *d)
{
    int i;
    f((void *) value->name, d);
    f((void *) value->semantic, d);
    freetypeinfo(&value->type, f, d);
    if (value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        for (i = 0; i < value->value_count; i++)
            freevalue(&value->valuesSS[i].value, f, d);
    f(value->values, d);
}